

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transitions.hpp
# Opt level: O3

available_transtions_table *
afsm::transitions::
state_transition_table<afsm::inner_state_machine<vending::vending_def::on,afsm::state_machine<vending::vending_def,afsm::none,afsm::none,afsm::detail::observer_wrapper>>,vending::vending_def::on,unsigned_long>
::get_available_transitions_table<0ul,1ul,2ul>(indexes_tuple<0UL,_1UL,_2UL> *param_1)

{
  int iVar1;
  initializer_list<const_afsm::detail::event_base::id_type_*> __l;
  initializer_list<const_afsm::detail::event_base::id_type_*> __l_00;
  initializer_list<const_afsm::detail::event_base::id_type_*> __l_01;
  allocator_type local_32;
  less<const_afsm::detail::event_base::id_type_*> local_31;
  id_type *local_30;
  undefined1 *local_28;
  
  if (get_available_transitions_table<0ul,1ul,2ul>(psst::meta::indexes_tuple<0ul,1ul,2ul>const&)::
      _table == '\0') {
    iVar1 = __cxa_guard_acquire(&get_available_transitions_table<0ul,1ul,2ul>(psst::meta::indexes_tuple<0ul,1ul,2ul>const&)
                                 ::_table);
    if (iVar1 != 0) {
      local_30 = (id_type *)&afsm::detail::event<afsm::none>::id;
      local_28 = &afsm::detail::event<vending::events::start_maintenance>::id;
      __l._M_len = 2;
      __l._M_array = &local_30;
      std::
      set<const_afsm::detail::event_base::id_type_*,_std::less<const_afsm::detail::event_base::id_type_*>,_std::allocator<const_afsm::detail::event_base::id_type_*>_>
      ::set(state_transition_table<afsm::inner_state_machine<vending::vending_def::on,_afsm::state_machine<vending::vending_def,_afsm::none,_afsm::none,_afsm::detail::observer_wrapper>_>,_vending::vending_def::on,_unsigned_long>
            ::get_available_transitions_table<0UL,_1UL,_2UL>::_table._M_elems,__l,&local_31,
            &local_32);
      local_30 = (id_type *)&afsm::detail::event<vending::events::end_maintenance>::id;
      __l_00._M_len = 1;
      __l_00._M_array = &local_30;
      std::
      set<const_afsm::detail::event_base::id_type_*,_std::less<const_afsm::detail::event_base::id_type_*>,_std::allocator<const_afsm::detail::event_base::id_type_*>_>
      ::set(state_transition_table<afsm::inner_state_machine<vending::vending_def::on,_afsm::state_machine<vending::vending_def,_afsm::none,_afsm::none,_afsm::detail::observer_wrapper>_>,_vending::vending_def::on,_unsigned_long>
            ::get_available_transitions_table<0UL,_1UL,_2UL>::_table._M_elems + 1,__l_00,&local_31,
            &local_32);
      local_30 = (id_type *)&afsm::detail::event<afsm::none>::id;
      local_28 = &afsm::detail::event<vending::events::start_maintenance>::id;
      __l_01._M_len = 2;
      __l_01._M_array = &local_30;
      std::
      set<const_afsm::detail::event_base::id_type_*,_std::less<const_afsm::detail::event_base::id_type_*>,_std::allocator<const_afsm::detail::event_base::id_type_*>_>
      ::set(state_transition_table<afsm::inner_state_machine<vending::vending_def::on,_afsm::state_machine<vending::vending_def,_afsm::none,_afsm::none,_afsm::detail::observer_wrapper>_>,_vending::vending_def::on,_unsigned_long>
            ::get_available_transitions_table<0UL,_1UL,_2UL>::_table._M_elems + 2,__l_01,&local_31,
            &local_32);
      __cxa_atexit(std::
                   array<std::set<const_afsm::detail::event_base::id_type_*,_std::less<const_afsm::detail::event_base::id_type_*>,_std::allocator<const_afsm::detail::event_base::id_type_*>_>,_3UL>
                   ::~array,&state_transition_table<afsm::inner_state_machine<vending::vending_def::on,_afsm::state_machine<vending::vending_def,_afsm::none,_afsm::none,_afsm::detail::observer_wrapper>_>,_vending::vending_def::on,_unsigned_long>
                             ::get_available_transitions_table<0UL,_1UL,_2UL>::_table,&__dso_handle)
      ;
      __cxa_guard_release(&get_available_transitions_table<0ul,1ul,2ul>(psst::meta::indexes_tuple<0ul,1ul,2ul>const&)
                           ::_table);
    }
  }
  return &state_transition_table<afsm::inner_state_machine<vending::vending_def::on,_afsm::state_machine<vending::vending_def,_afsm::none,_afsm::none,_afsm::detail::observer_wrapper>_>,_vending::vending_def::on,_unsigned_long>
          ::get_available_transitions_table<0UL,_1UL,_2UL>::_table;
}

Assistant:

static available_transtions_table const&
    get_available_transitions_table( ::psst::meta::indexes_tuple< Indexes ...> const& )
    {
        static available_transtions_table _table{{
            ::afsm::detail::make_event_set(
                typename ::psst::meta::transform<
                    def::detail::event_type,
                    typename ::psst::meta::find_if<
                        def::originates_from<
                            typename inner_states_def::template type< Indexes >
                        >:: template type,
                        transitions_tuple
                    >::type
                 > ::type {}
            ) ...
        }};

        return _table;
    }